

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtils.cpp
# Opt level: O2

string * ApprovalTests::StringUtils::leftTrim(string *__return_storage_ptr__,string *s)

{
  _Iter_pred<ApprovalTests::StringUtils::leftTrim(std::__cxx11::string)::__0> *p_Var1;
  _Iter_pred<ApprovalTests::StringUtils::leftTrim(std::__cxx11::string)::__0> *p_Var2;
  bool bVar3;
  size_type sVar4;
  long lVar5;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __it;
  _Iter_pred<ApprovalTests::StringUtils::leftTrim(std::__cxx11::string)::__0> *this;
  _Iter_pred<ApprovalTests::StringUtils::leftTrim(std::__cxx11::string)::__0> *p_Var6;
  
  p_Var2 = (_Iter_pred<ApprovalTests::StringUtils::leftTrim(std::__cxx11::string)::__0> *)
           (s->_M_dataplus)._M_p;
  sVar4 = s->_M_string_length;
  p_Var1 = p_Var2 + sVar4;
  __it._M_current = (char *)s;
  this = p_Var2;
  for (lVar5 = (long)sVar4 >> 2; 0 < lVar5; lVar5 = lVar5 + -1) {
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<ApprovalTests::StringUtils::leftTrim(std::__cxx11::string)::$_0>::operator()
                      (this,__it);
    p_Var6 = this;
    if (bVar3) goto LAB_0013ceaf;
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<ApprovalTests::StringUtils::leftTrim(std::__cxx11::string)::$_0>::operator()
                      (this + 1,__it);
    p_Var6 = this + 1;
    if (bVar3) goto LAB_0013ceaf;
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<ApprovalTests::StringUtils::leftTrim(std::__cxx11::string)::$_0>::operator()
                      (this + 2,__it);
    p_Var6 = this + 2;
    if (bVar3) goto LAB_0013ceaf;
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<ApprovalTests::StringUtils::leftTrim(std::__cxx11::string)::$_0>::operator()
                      (this + 3,__it);
    p_Var6 = this + 3;
    if (bVar3) goto LAB_0013ceaf;
    this = this + 4;
    sVar4 = sVar4 - 4;
  }
  if (sVar4 != 1) {
    if (sVar4 != 2) {
      p_Var6 = p_Var1;
      if ((sVar4 != 3) ||
         (bVar3 = __gnu_cxx::__ops::
                  _Iter_pred<ApprovalTests::StringUtils::leftTrim(std::__cxx11::string)::$_0>::
                  operator()(this,__it), p_Var6 = this, bVar3)) goto LAB_0013ceaf;
      this = this + 1;
    }
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<ApprovalTests::StringUtils::leftTrim(std::__cxx11::string)::$_0>::operator()
                      (this,__it);
    p_Var6 = this;
    if (bVar3) goto LAB_0013ceaf;
    this = this + 1;
  }
  bVar3 = __gnu_cxx::__ops::
          _Iter_pred<ApprovalTests::StringUtils::leftTrim(std::__cxx11::string)::$_0>::operator()
                    (this,__it);
  p_Var6 = p_Var1;
  if (bVar3) {
    p_Var6 = this;
  }
LAB_0013ceaf:
  ::std::__cxx11::string::erase(s,p_Var2,p_Var6);
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)s);
  return __return_storage_ptr__;
}

Assistant:

APPROVAL_TESTS_NO_DISCARD
    std::string StringUtils::leftTrim(std::string s)
    {

        s.erase(s.begin(), std::find_if(s.begin(), s.end(), [](unsigned char ch) {
                    return !std::isspace(ch);
                }));
        return s;
    }